

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O3

OPTIONHANDLER_RESULT AddOptionInternal(OPTIONHANDLER_HANDLE handle,char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  void *pvVar3;
  char *cloneOfName;
  OPTION temp;
  char *local_30;
  char *local_28;
  void *local_20;
  
  iVar1 = mallocAndStrcpy_s(&local_30,name);
  if (iVar1 == 0) {
    pvVar3 = (*handle->cloneOption)(name,value);
    if (pvVar3 == (void *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                  ,"AddOptionInternal",0x4c,1,"unable to clone value");
      }
    }
    else {
      local_28 = local_30;
      local_20 = pvVar3;
      iVar1 = VECTOR_push_back(handle->storage,&local_28,1);
      if (iVar1 == 0) {
        return OPTIONHANDLER_OK;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                  ,"AddOptionInternal",0x59,1,"unable to VECTOR_push_back");
      }
      (*handle->destroyOption)(name,pvVar3);
    }
    free(local_30);
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                ,"AddOptionInternal",0x42,1,"unable to clone name");
      return OPTIONHANDLER_ERROR;
    }
  }
  return OPTIONHANDLER_ERROR;
}

Assistant:

static OPTIONHANDLER_RESULT AddOptionInternal(OPTIONHANDLER_HANDLE handle, const char* name, const void* value)
{
    OPTIONHANDLER_RESULT result;
    const char* cloneOfName;
    if (mallocAndStrcpy_s((char**)&cloneOfName, name) != 0)
    {
        /*Codes_SRS_OPTIONHANDLER_02_009: [ Otherwise, OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_ERROR. ]*/
        LogError("unable to clone name");
        result = OPTIONHANDLER_ERROR;
    }
    else
    {
        /*Codes_SRS_OPTIONHANDLER_02_006: [ OptionHandler_AddProperty shall call pfCloneOption passing name and value. ]*/
        void* cloneOfValue = handle->cloneOption(name, value);
        if (cloneOfValue == NULL)
        {
            /*Codes_SRS_OPTIONHANDLER_02_009: [ Otherwise, OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_ERROR. ]*/
            LogError("unable to clone value");
            free((void*)cloneOfName);
            result = OPTIONHANDLER_ERROR;
        }
        else
        {
            OPTION temp;
            temp.name = cloneOfName;
            temp.storage = cloneOfValue;
            /*Codes_SRS_OPTIONHANDLER_02_007: [ OptionHandler_AddProperty shall use VECTOR APIs to save the name and the newly created clone of value. ]*/
            if (VECTOR_push_back(handle->storage, &temp, 1) != 0)
            {
                /*Codes_SRS_OPTIONHANDLER_02_009: [ Otherwise, OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_ERROR. ]*/
                LogError("unable to VECTOR_push_back");
                handle->destroyOption(name, cloneOfValue);
                free((void*)cloneOfName);
                result = OPTIONHANDLER_ERROR;
            }
            else
            {
                /*Codes_SRS_OPTIONHANDLER_02_008: [ If all the operations succed then OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_OK. ]*/
                result = OPTIONHANDLER_OK;
            }
        }
    }

    return result;
}